

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec16.c
# Opt level: O2

void If_CluCountOnesInCofs(word *pTruth,int nVars,int *pStore)

{
  int *piVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  
  bVar2 = (char)nVars - 6U & 0x1f;
  uVar9 = 0;
  uVar5 = (ulong)(uint)(1 << bVar2);
  if (1 << bVar2 < 1) {
    uVar5 = uVar9;
  }
  uVar6 = 6;
  if (nVars < 6) {
    uVar6 = nVars;
  }
  memset(pStore,0,(long)nVars * 8);
  uVar7 = (ulong)uVar6;
  if ((int)uVar6 < 1) {
    uVar7 = uVar9;
  }
  if (nVars < 7) {
    uVar5 = 1;
  }
  for (; uVar9 != uVar5; uVar9 = uVar9 + 1) {
    for (lVar8 = 0; uVar7 * 8 != lVar8; lVar8 = lVar8 + 8) {
      iVar3 = If_CluCountOnes(*(ulong *)((long)Truth6 + lVar8) & pTruth[uVar9]);
      piVar1 = (int *)((long)pStore + lVar8 + 4);
      *piVar1 = *piVar1 + iVar3;
    }
  }
  if (6 < nVars) {
    for (uVar9 = 0; uVar9 != uVar5; uVar9 = uVar9 + 1) {
      for (lVar8 = 0; (ulong)(uint)nVars - 6 != lVar8; lVar8 = lVar8 + 1) {
        if (((uint)uVar9 >> ((uint)lVar8 & 0x1f) & 1) != 0) {
          iVar3 = If_CluCountOnes(pTruth[uVar9]);
          pStore[lVar8 * 2 + 0xd] = pStore[lVar8 * 2 + 0xd] + iVar3;
        }
      }
    }
  }
  iVar3 = 0;
  for (uVar9 = 0; uVar5 != uVar9; uVar9 = uVar9 + 1) {
    iVar4 = If_CluCountOnes(pTruth[uVar9]);
    iVar3 = iVar3 + iVar4;
  }
  uVar9 = 0;
  uVar5 = (ulong)(uint)nVars;
  if (nVars < 1) {
    uVar5 = uVar9;
  }
  for (; uVar5 != uVar9; uVar9 = uVar9 + 1) {
    pStore[uVar9 * 2] = iVar3 - pStore[uVar9 * 2 + 1];
  }
  return;
}

Assistant:

void If_CluCountOnesInCofs( word * pTruth, int nVars, int * pStore )
{
    int nWords = If_CluWordNum( nVars );
    int i, k, nOnes = 0, Limit = Abc_MinInt( nVars, 6 );
    memset( pStore, 0, sizeof(int) * 2 * nVars );
    // compute positive cofactors
    for ( k = 0; k < nWords; k++ )
        for ( i = 0; i < Limit; i++ )
            pStore[2*i+1] += If_CluCountOnes( pTruth[k] & Truth6[i] );
    if ( nVars > 6 )
    for ( k = 0; k < nWords; k++ )
        for ( i = 6; i < nVars; i++ )
            if ( k & (1 << (i-6)) )
                pStore[2*i+1] += If_CluCountOnes( pTruth[k] );
    // compute negative cofactors
    for ( k = 0; k < nWords; k++ )
        nOnes += If_CluCountOnes( pTruth[k] );
    for ( i = 0; i < nVars; i++ )
        pStore[2*i] = nOnes - pStore[2*i+1];
}